

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynarray.cpp
# Opt level: O0

void __thiscall DynArray::Add(DynArray *this,char *value)

{
  char *__dest;
  char *new_data;
  char *value_local;
  DynArray *this_local;
  
  if (this->length == this->data_size) {
    this->data_size = this->data_size << 1;
    __dest = (char *)malloc((ulong)(this->data_size * this->elem_size));
    memcpy(__dest,this->data,(ulong)(this->length * this->elem_size));
    free(this->data);
    this->data = __dest;
  }
  memcpy(this->data + this->length * this->elem_size,value,(ulong)this->elem_size);
  this->length = this->length + 1;
  return;
}

Assistant:

void
DynArray::Add(char *value)
{
  if (length == data_size) {
    data_size *= 2;

    char *new_data;
    new_data = (char *)malloc(data_size * elem_size);
    memcpy(new_data, data, length * elem_size);
    free(data);
    data = new_data;
  }

  // copy the data to the array
  memcpy(&data[length * elem_size], value, elem_size);
  length++;
}